

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# onesided.c
# Opt level: O1

void pnga_scatter_acc2d(Integer g_a,void *v,Integer *i,Integer *j,Integer nv,void *alpha)

{
  long proc;
  Integer *base;
  logical lVar1;
  long lVar2;
  Integer *owner;
  long lVar3;
  long nv_00;
  long lVar4;
  long lVar5;
  Integer subscrpt [2];
  char err_string [256];
  Integer local_180;
  Integer *local_178;
  void *local_170;
  long local_168;
  Integer *local_160;
  double local_158;
  void *local_150;
  Integer local_148;
  Integer local_140;
  char local_138 [264];
  
  if (0 < nv) {
    local_168 = (long)GA[g_a + 1000].type;
    local_180 = nv;
    local_178 = j;
    local_170 = v;
    local_150 = alpha;
    if ((g_a < -1000) || ((long)_max_global_array <= g_a + 1000)) {
      sprintf(local_138,"%s: INVALID ARRAY HANDLE","ga_scatter_acc");
      pnga_error(local_138,g_a);
    }
    if (GA[g_a + 1000].actv == 0) {
      sprintf(local_138,"%s: ARRAY NOT ACTIVE","ga_scatter_acc");
      pnga_error(local_138,g_a);
    }
    GAstat.numsca = GAstat.numsca + 1;
    base = (Integer *)pnga_malloc(local_180,0x3f2,"ga_scatter_acc--p");
    if (0 < local_180) {
      lVar4 = 0;
      owner = base;
      local_160 = base;
      do {
        local_148 = i[lVar4];
        local_140 = local_178[lVar4];
        lVar1 = pnga_locate(g_a,&local_148,owner);
        if (lVar1 == 0) {
          sprintf(local_138,"invalid i/j=(%ld,%ld)",i[lVar4],local_178[lVar4]);
          base = local_160;
          pnga_error(local_138,g_a);
        }
        lVar4 = lVar4 + 1;
        owner = owner + 1;
      } while (lVar4 < local_180);
    }
    lVar4 = *(long *)(BYTE_ARRAY_001d5e51 + local_168 * 0x10 + 0x6a7);
    local_158 = (double)lVar4;
    GAbytes.scatot = (double)local_180 * local_158 + GAbytes.scatot;
    ga_sort_scat(&local_180,local_170,i,local_178,base,local_168);
    lVar5 = 0;
    do {
      proc = base[lVar5];
      lVar2 = local_180 - lVar5;
      if (lVar2 == 0 || local_180 < lVar5) {
        nv_00 = 0;
      }
      else {
        lVar3 = 0;
        do {
          nv_00 = lVar3;
          if (proc != base[lVar5 + lVar3]) break;
          lVar3 = lVar3 + 1;
          nv_00 = lVar2;
        } while (lVar2 != lVar3);
      }
      if (proc == GAme) {
        GAbytes.scaloc = (double)nv_00 * local_158 + GAbytes.scaloc;
      }
      gai_scatter_acc_local
                (g_a,(void *)(lVar5 * lVar4 + (long)local_170),i + lVar5,local_178 + lVar5,nv_00,
                 local_150,proc);
      lVar5 = lVar5 + nv_00;
    } while (lVar5 < local_180);
    pnga_free(base);
  }
  return;
}

Assistant:

void pnga_scatter_acc2d(g_a, v, i, j, nv, alpha)
     Integer g_a, nv, *i, *j;
     void *v, *alpha;
{
register Integer k;
Integer item_size;
Integer first, nelem, proc, type=GA[GA_OFFSET + g_a].type;
Integer *int_ptr;
Integer subscrpt[2];

  if (nv < 1) return;

  ga_check_handleM(g_a, "ga_scatter_acc");
  
  GAstat.numsca++;

  int_ptr = (Integer*) pnga_malloc(nv, MT_F_INT, "ga_scatter_acc--p");

  /* find proc that owns the (i,j) element; store it in temp: int_ptr */
  for(k=0; k< nv; k++) {
    subscrpt[0] = *(i+k);
    subscrpt[1] = *(j+k);
    if(! pnga_locate(g_a, subscrpt, int_ptr+k)){
         char err_string[ERR_STR_LEN];
         sprintf(err_string,"invalid i/j=(%ld,%ld)", (long)i[k], (long)j[k]);
         pnga_error(err_string,g_a);
    }
  }

  /* determine limit for message size --  v,i, & j will travel together */
  item_size = GAsizeofM(type);
  GAbytes.scatot += (double)item_size*nv ;

  /* Sort the entries by processor */
  ga_sort_scat(&nv, v, i, j, int_ptr, type );

  /* go through the list again executing scatter for each processor */

  first = 0;
  do {
      proc = int_ptr[first];
      nelem = 0;

      /* count entries for proc from "first" to last */
      for(k=first; k< nv; k++){
        if(proc == int_ptr[k]) nelem++;
        else break;
      }

      if(proc == GAme){
             GAbytes.scaloc += (double)item_size* nelem ;
      }

      gai_scatter_acc_local(g_a, ((char*)v)+item_size*first, i+first,
                           j+first, nelem, alpha, proc);
      first += nelem;

  }while (first< nv);

  pnga_free(int_ptr);

}